

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Scc_Apu.cpp
# Opt level: O3

void __thiscall Scc_Apu::run_until(Scc_Apu *this,blip_time_t end_time)

{
  osc_t *poVar1;
  uchar uVar2;
  Blip_Buffer *buf;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  blip_time_t t;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int index;
  long lVar11;
  int iVar12;
  int local_60;
  
  lVar11 = 0;
  do {
    buf = this->oscs[lVar11].output;
    if (buf != (Blip_Buffer *)0x0) {
      buf->modified_ = 1;
      iVar12 = (*(byte *)((long)(this->synth).impulses + lVar11 * 2 + -0x3b) & 0xf) * 0x100;
      uVar7 = (uint)(byte)(this->synth).impulses[lVar11 + -0x1e];
      uVar8 = iVar12 + uVar7;
      local_60 = 0;
      if (((this->regs[0x8f] >> ((uint)lVar11 & 0x1f) & 1) != 0) &&
         ((int)buf->clock_rate_ + 0x80000U >> 0x12 <= uVar8)) {
        local_60 = (*(byte *)((long)(this->synth).impulses + lVar11 + -0x32) & 0xf) << 3;
      }
      poVar1 = this->oscs + lVar11;
      lVar3 = lVar11 * 0x20 + 0x7c;
      lVar9 = (ulong)(lVar11 != 4) * 0x20;
      iVar4 = (char)this->regs[(long)poVar1->phase + lVar9 + lVar3 + -0x9c] * local_60;
      t = this->last_time;
      iVar5 = iVar4 - poVar1->last_amp;
      if (iVar5 != 0) {
        poVar1->last_amp = iVar4;
        Blip_Synth<8,_1>::offset(&this->synth,t,iVar5,buf);
        t = this->last_time;
      }
      iVar4 = t + poVar1->delay;
      if (iVar4 < end_time) {
        iVar12 = iVar12 + uVar7 + 1;
        if (local_60 == 0) {
          iVar5 = (int)((uVar8 + end_time) - iVar4) / iVar12;
          poVar1->phase = poVar1->phase + iVar5 & 0x1f;
          iVar4 = iVar4 + iVar5 * iVar12;
        }
        else {
          lVar3 = lVar9 + lVar3 + -0x20;
          uVar10 = (ulong)poVar1->phase;
          iVar5 = (int)(char)this->regs[uVar10 + lVar3 + -0x7c];
          do {
            uVar8 = (int)uVar10 + 1U & 0x1f;
            uVar10 = (ulong)uVar8;
            uVar2 = this->regs[uVar10 + lVar3 + -0x7c];
            iVar6 = (char)uVar2 - iVar5;
            if (iVar6 != 0) {
              Blip_Synth<8,_1>::offset(&this->synth,iVar4,iVar6 * local_60,buf);
              iVar5 = (int)(char)uVar2;
            }
            iVar4 = iVar4 + iVar12;
          } while (iVar4 < end_time);
          poVar1->phase = uVar8;
          poVar1->last_amp = local_60 * (char)this->regs[uVar10 + lVar3 + -0x7c];
        }
      }
      poVar1->delay = iVar4 - end_time;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  this->last_time = end_time;
  return;
}

Assistant:

void Scc_Apu::run_until( blip_time_t end_time )
{
	for ( int index = 0; index < osc_count; index++ )
	{
		osc_t& osc = oscs [index];
		
		Blip_Buffer* const output = osc.output;
		if ( !output )
			continue;
		output->set_modified();
		
		blip_time_t period = (regs [0x80 + index * 2 + 1] & 0x0F) * 0x100 +
				regs [0x80 + index * 2] + 1;
		int volume = 0;
		if ( regs [0x8F] & (1 << index) )
		{
			blip_time_t inaudible_period = (blargg_ulong) (output->clock_rate() +
					inaudible_freq * 32) / (inaudible_freq * 16);
			if ( period > inaudible_period )
				volume = (regs [0x8A + index] & 0x0F) * (amp_range / 256 / 15);
		}
		
		BOOST::int8_t const* wave = (BOOST::int8_t*) regs + index * wave_size;
		if ( index == osc_count - 1 )
			wave -= wave_size; // last two oscs share wave
		{
			int amp = wave [osc.phase] * volume;
			int delta = amp - osc.last_amp;
			if ( delta )
			{
				osc.last_amp = amp;
				synth.offset( last_time, delta, output );
			}
		}
		
		blip_time_t time = last_time + osc.delay;
		if ( time < end_time )
		{
			if ( !volume )
			{
				// maintain phase
				blargg_long count = (end_time - time + period - 1) / period;
				osc.phase = (osc.phase + count) & (wave_size - 1);
				time += count * period;
			}
			else
			{
				
				int phase = osc.phase;
				int last_wave = wave [phase];
				phase = (phase + 1) & (wave_size - 1); // pre-advance for optimal inner loop
				
				do
				{
					int amp = wave [phase];
					phase = (phase + 1) & (wave_size - 1);
					int delta = amp - last_wave;
					if ( delta )
					{
						last_wave = amp;
						synth.offset( time, delta * volume, output );
					}
					time += period;
				}
				while ( time < end_time );
				
				osc.phase = phase = (phase - 1) & (wave_size - 1); // undo pre-advance
				osc.last_amp = wave [phase] * volume;
			}
		}
		osc.delay = time - end_time;
	}
	last_time = end_time;
}